

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void build_imm(m68k_info *info,int opcode,int data)

{
  cs_m68k *pcVar1;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  cs_m68k *ext;
  cs_m68k_op *op;
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  
  pcVar1 = build_init_op((m68k_info *)CONCAT44(in_ESI,in_EDX),
                         (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                         (int)in_stack_ffffffffffffffe8,
                         (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),in_ESI);
  pcVar1->operands[0].type = M68K_OP_IMM;
  pcVar1->operands[0].address_mode = M68K_AM_IMMEDIATE;
  pcVar1->operands[0].field_0 = (anon_union_8_5_85a7a27f_for_cs_m68k_op_0)(long)in_EDX;
  return;
}

Assistant:

static void build_imm(m68k_info *info, int opcode, int data)
{
	cs_m68k_op* op;
	cs_m68k* ext = build_init_op(info, opcode, 1, 0);

	MCInst_setOpcode(info->inst, opcode);

	op = &ext->operands[0];

	op->type = M68K_OP_IMM;
	op->address_mode = M68K_AM_IMMEDIATE;
	op->imm = data;
}